

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it,PolicyStackEntry *t)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  size_type sVar2;
  size_type sVar3;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar4;
  PolicyStackEntry *t_local;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *this_local;
  iterator it_local;
  
  it_local.Tree = (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)it.Position;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  sVar3 = std::
          vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
          ::size(&this->Data);
  pcVar1 = it_local.Tree;
  if (sVar2 != sVar3) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0xb5,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  pcVar4 = (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  if (pcVar1 <= pcVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->UpPositions,(value_type_conflict1 *)&it_local);
    std::vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>::
    push_back(&this->Data,t);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
    iterator::iterator((iterator *)&it_local.Position,this,sVar2);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0xb6,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }